

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  pointer pHVar3;
  pointer pHVar4;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  *__range1;
  uint name_checksum;
  Data *this_local;
  string_view hostname_local;
  
  hostname_local._M_len = (size_t)hostname._M_str;
  this_local = (Data *)hostname._M_len;
  uVar2 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __end1 = std::
           vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ::begin(&this->m_hosts);
  host = (unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
          *)std::
            vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
            ::end(&this->m_hosts);
  do {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                                *)&host);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
              ::operator*(&__end1);
    pHVar3 = std::
             unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ::operator->(this_00);
    if (uVar2 == (pHVar3->super_Directory).name_checksum) {
      pHVar4 = std::
               unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               ::operator->(this_00);
      rhs._M_str = (char *)pHVar3;
      rhs._M_len = hostname_local._M_len;
      bVar1 = jessilib::equalsi<char,char>
                        ((jessilib *)&(pHVar4->super_Directory).name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_local,rhs);
      if (bVar1) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			return true;
		}
	}

	return false;
}